

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::StoreResult(cmGetPropertyCommand *this,char *value)

{
  char *local_38;
  char *value_local;
  cmGetPropertyCommand *this_local;
  
  if (this->InfoType == OutSet) {
    if (value == (char *)0x0) {
      local_38 = "0";
    }
    else {
      local_38 = "1";
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&this->Variable,local_38);
  }
  else if (value == (char *)0x0) {
    cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,&this->Variable);
  }
  else {
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&this->Variable,value);
  }
  return true;
}

Assistant:

bool cmGetPropertyCommand::StoreResult(const char* value)
{
  if(this->InfoType == OutSet)
    {
    this->Makefile->AddDefinition(this->Variable, value? "1":"0");
    }
  else // if(this->InfoType == OutValue)
    {
    if(value)
      {
      this->Makefile->AddDefinition(this->Variable, value);
      }
    else
      {
      this->Makefile->RemoveDefinition(this->Variable);
      }
    }
  return true;
}